

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O0

void __thiscall ParserProbModelXML::SetISD(ParserProbModelXML *this)

{
  xmlNodeSetPtr pxVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  ParserProbModelXML *pPVar5;
  ulong uVar6;
  ostream *poVar7;
  xmlXPathObjectPtr pxVar8;
  long lVar9;
  string *this_00;
  allocator<char> *paVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  MultiAgentDecisionProcessDiscreteFactoredStates *pMVar12;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  size_t j_2;
  size_t n;
  size_t j_1;
  vector<double,_std::allocator<double>_> *dist;
  xmlNodePtr data_node;
  string CPD_type;
  xmlNodePtr p;
  int j;
  xmlNodePtr isd_node;
  xmlNodeSetPtr isd_nodeset;
  xmlXPathObjectPtr isd_nodes;
  stringstream xpath_ss;
  string factor_name;
  bool setUniform;
  size_t i;
  FSDist_COF *isd;
  NamedDescribedEntity *in_stack_fffffffffffffba8;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_fffffffffffffbb0;
  xmlNodePtr in_stack_fffffffffffffbb8;
  undefined6 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc6;
  undefined1 in_stack_fffffffffffffbc7;
  ParserProbModelXML *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  allocator<char> *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  xmlNodePtr in_stack_fffffffffffffbf8;
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface *in_stack_fffffffffffffc58;
  FSDist_COF *in_stack_fffffffffffffc60;
  MultiAgentDecisionProcessDiscreteFactoredStates *local_368;
  allocator<char> *local_2d0;
  allocator<char> local_271;
  string local_270 [8];
  xmlNodePtr in_stack_fffffffffffffd98;
  ParserProbModelXML *in_stack_fffffffffffffda0;
  allocator<char> local_241;
  FSDist_COF *in_stack_fffffffffffffdc0;
  int local_214;
  xmlNodePtr local_210;
  string local_200 [32];
  xmlXPathObjectPtr local_1e0;
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  string local_50 [39];
  byte local_29;
  ulong local_28;
  ParserProbModelXML *local_10;
  
  pPVar5 = (ParserProbModelXML *)operator_new(0x48);
  FSDist_COF::FSDist_COF(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  local_28 = 0;
  local_10 = pPVar5;
  do {
    uVar3 = local_28;
    uVar6 = (**(code **)(**(long **)(in_RDI + 0x80) + 0xa8))();
    if (uVar6 <= uVar3) {
      FSDist_COF::SanityCheck(in_stack_fffffffffffffdc0);
      MultiAgentDecisionProcessDiscreteFactoredStates::SetISD
                (in_stack_fffffffffffffbb0,(FactoredStateDistribution *)in_stack_fffffffffffffba8);
      return;
    }
    local_29 = 0;
    (**(code **)(**(long **)(in_RDI + 0x80) + 200))(*(long **)(in_RDI + 0x80),local_28 & 0xffffffff)
    ;
    NamedDescribedEntity::GetName_abi_cxx11_(in_stack_fffffffffffffba8);
    std::__cxx11::stringstream::stringstream(local_1d8);
    std::operator<<(local_1c8,
                    "/ProbModelXML/ProbNet/Potentials/Potential[@role=\'conditionalProbability\']/Variables/Variable"
                   );
    poVar7 = std::operator<<(local_1c8,"[starts-with(@name, \"");
    poVar7 = std::operator<<(poVar7,local_50);
    std::operator<<(poVar7,"\") and @timeSlice=\'0\']");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::c_str();
    pxVar8 = GetNodesMatchingExpression
                       (in_stack_fffffffffffffbc8,
                        (xmlChar *)
                        CONCAT17(in_stack_fffffffffffffbc7,
                                 CONCAT16(in_stack_fffffffffffffbc6,in_stack_fffffffffffffbc0)),
                        in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_200);
    local_1e0 = pxVar8;
    if (pxVar8 == (xmlXPathObjectPtr)0x0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Warning: Variable ");
      poVar7 = std::operator<<(poVar7,local_50);
      poVar7 = std::operator<<(poVar7," has no ISD. Setting to uniform. ");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      local_29 = 1;
    }
    else {
      pxVar1 = pxVar8->nodesetval;
      local_210 = *pxVar1->nodeTab;
      for (local_214 = 0; local_214 < pxVar1->nodeNr; local_214 = local_214 + 1) {
        local_210 = pxVar1->nodeTab[local_214];
        lVar9 = xmlChildElementCount(local_210->parent);
        if (lVar9 == 1) break;
      }
      lVar9 = xmlChildElementCount(local_210->parent);
      if (lVar9 != 1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"Warning: Variable ");
        poVar7 = std::operator<<(poVar7,local_50);
        poVar7 = std::operator<<(poVar7," has no ISD. Setting to uniform. ");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        local_29 = 1;
      }
      xmlGetProp(local_210->parent->parent,"type");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0);
      std::allocator<char>::~allocator(&local_241);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbf0,(char *)in_stack_fffffffffffffbe8,
                   in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffbf8 =
             FindChild((ParserProbModelXML *)
                       CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                       (xmlNodePtr)in_stack_fffffffffffffbc8,
                       (string *)
                       CONCAT17(in_stack_fffffffffffffbc7,
                                CONCAT16(in_stack_fffffffffffffbc6,in_stack_fffffffffffffbc0)));
        std::__cxx11::string::~string(local_270);
        std::allocator<char>::~allocator(&local_271);
        if (in_stack_fffffffffffffbf8 == (xmlNodePtr)0x0) {
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    __cxa_allocate_exception(0x28);
          std::operator+((char *)in_stack_fffffffffffffbf8,pbVar11);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffbb8,(char *)in_stack_fffffffffffffbb0);
          EParse::EParse((EParse *)pbVar11,in_stack_fffffffffffffbe8);
          __cxa_throw(pbVar11,&EParse::typeinfo,EParse::~EParse);
        }
        this_00 = (string *)ParseArray(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        local_2d0 = (allocator<char> *)0x0;
        in_stack_fffffffffffffbe8 = this_00;
        while (in_stack_fffffffffffffbe0 = local_2d0,
              paVar10 = (allocator<char> *)
                        std::vector<double,_std::allocator<double>_>::size
                                  ((vector<double,_std::allocator<double>_> *)this_00),
              in_stack_fffffffffffffbe0 < paVar10) {
          in_stack_fffffffffffffbd4 = SUB84(local_2d0,0);
          in_stack_fffffffffffffbc8 = local_10;
          in_stack_fffffffffffffbd0 = (undefined4)local_28;
          std::vector<double,_std::allocator<double>_>::at
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbb0,
                     (size_type)in_stack_fffffffffffffba8);
          FSDist_COF::SetProbability
                    ((FSDist_COF *)
                     CONCAT17(in_stack_fffffffffffffbc7,
                              CONCAT16(in_stack_fffffffffffffbc6,in_stack_fffffffffffffbc0)),
                     (Index)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                     (Index)in_stack_fffffffffffffbb8,(double)in_stack_fffffffffffffbb0);
          local_2d0 = local_2d0 + 1;
        }
      }
      else {
        in_stack_fffffffffffffbc7 =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
        if ((bool)in_stack_fffffffffffffbc7) {
          local_29 = 1;
        }
        else {
          in_stack_fffffffffffffbc6 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
          if ((bool)in_stack_fffffffffffffbc6) {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x28);
            std::operator+((char *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
            std::operator+(pbVar11,(char *)in_stack_fffffffffffffbb0);
            std::operator+(pbVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffbb0);
            std::operator+(pbVar11,(char *)in_stack_fffffffffffffbb0);
            EParse::EParse((EParse *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
            __cxa_throw(pbVar11,&EParse::typeinfo,EParse::~EParse);
          }
        }
      }
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
    }
    if ((local_29 & 1) != 0) {
      pMVar12 = (MultiAgentDecisionProcessDiscreteFactoredStates *)
                (**(code **)(**(long **)(in_RDI + 0x80) + 0xc0))
                          (*(long **)(in_RDI + 0x80),local_28 & 0xffffffff);
      auVar13._8_56_ = extraout_var;
      auVar13._0_8_ = extraout_XMM0_Qa;
      in_stack_fffffffffffffbb0 = pMVar12;
      for (local_368 = (MultiAgentDecisionProcessDiscreteFactoredStates *)0x0; local_368 < pMVar12;
          local_368 = (MultiAgentDecisionProcessDiscreteFactoredStates *)
                      &(local_368->super_MultiAgentDecisionProcess).field_0x1) {
        auVar2 = vcvtusi2ss_avx512f(auVar13._0_16_,pMVar12);
        auVar13 = ZEXT864((ulong)(1.0 / (double)auVar2._0_4_));
        FSDist_COF::SetProbability
                  ((FSDist_COF *)
                   CONCAT17(in_stack_fffffffffffffbc7,
                            CONCAT16(in_stack_fffffffffffffbc6,in_stack_fffffffffffffbc0)),
                   (Index)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                   (Index)in_stack_fffffffffffffbb8,(double)in_stack_fffffffffffffbb0);
      }
    }
    xmlXPathFreeObject(local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1d8);
    std::__cxx11::string::~string(local_50);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void ParserProbModelXML::SetISD()
{
    FSDist_COF* isd = new FSDist_COF(*_m_fDecPOMDP);
    for(size_t i = 0; i < _m_fDecPOMDP->GetNrStateFactors(); i++)
    {
        bool setUniform = false;
        string factor_name = _m_fDecPOMDP->GetStateFactorDiscrete(i)->GetName();
        stringstream xpath_ss; 
        xpath_ss << "/ProbModelXML/ProbNet/Potentials/Potential[@role='conditionalProbability']/Variables/Variable";
        xpath_ss << "[starts-with(@name, \"" << factor_name << "\") and @timeSlice='0']";
        xmlXPathObjectPtr isd_nodes = GetNodesMatchingExpression((xmlChar*) xpath_ss.str().c_str());
        if(isd_nodes == NULL)
        {
            cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
            setUniform = true;
        }
        else
        {
            xmlNodeSetPtr isd_nodeset = isd_nodes->nodesetval;
            xmlNodePtr isd_node = isd_nodeset->nodeTab[0];
            for(int j = 0; j < isd_nodeset->nodeNr; j++)
            {
                isd_node = isd_nodeset->nodeTab[j];
                xmlNodePtr p = isd_node->parent;
                if(xmlChildElementCount(p) == 1)
                    break; //ISD nodes are one-dimensional arrays
            }
            if(xmlChildElementCount(isd_node->parent) != 1)
            {
                cout << "Warning: Variable " << factor_name << " has no ISD. Setting to uniform. " << endl;
                setUniform = true;
            }
            string CPD_type = (char*) xmlGetProp(isd_node->parent->parent, (xmlChar*) "type"); //Potential
            if(CPD_type == "Table")
            {
                xmlNodePtr data_node = FindChild(isd_node->parent->parent, "Values");
                if(data_node == NULL)
                    throw EParse("Variable " + factor_name + " has an empty ISD");
                const vector<double>* dist = ParseArray(data_node);
                for(size_t j = 0; j < dist->size(); j++)
                {
                    isd->SetProbability(i, j, dist->at(j));
                }
            }
            else if(CPD_type == "Uniform")
            {
                setUniform = true;
            }
            else if(CPD_type == "Tree/ADD")
            {
                throw EParse("At variable " + factor_name + ": CPD type \"" + CPD_type + "\" not allowed for initial belief.");
            }
        }
        if(setUniform)
        {
            size_t n = _m_fDecPOMDP->GetNrValuesForFactor(i);
            for(size_t j = 0; j < n; j++)
            {
                isd->SetProbability(i, j, 1.0/(float) n);
            }
        }

        xmlXPathFreeObject (isd_nodes);
    }

    isd->SanityCheck();
    _m_fDecPOMDP->SetISD(isd);
  
    return;
}